

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O3

void iterator_seek_to_min_key_with_deletes_test(void)

{
  fdb_status fVar1;
  int insert_opt;
  char *__format;
  fdb_iterator *it;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_doc *rdoc;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_config fconfig;
  fdb_iterator *local_148;
  fdb_kvs_handle *local_140;
  fdb_file_handle *local_138;
  fdb_doc *local_130;
  fdb_kvs_config local_128;
  timeval local_110;
  fdb_config local_100;
  
  gettimeofday(&local_110,(__timezone_ptr_t)0x0);
  memleak_start();
  local_148 = (fdb_iterator *)0x0;
  local_130 = (fdb_doc *)0x0;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  iterator_test* > errorlog.txt");
  fVar1 = fdb_open(&local_138,"./iterator_test1",&local_100);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_kvs_open_default(local_138,&local_140,&local_128);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c8f5;
    fdb_set_kv(local_140,"B",1,(void *)0x0,0);
    fdb_set_kv(local_140,"C",1,(void *)0x0,0);
    fVar1 = fdb_del_kv(local_140,"B",1);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c8fc;
    fVar1 = fdb_iterator_init(local_140,&local_148,"A",1,"B",1,0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c903;
    fVar1 = fdb_iterator_get(local_148,&local_130);
    if (fVar1 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c908;
    fVar1 = fdb_iterator_seek_to_min(local_148);
    if (fVar1 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c90d;
    fVar1 = fdb_iterator_close(local_148);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c912;
    fVar1 = fdb_close(local_138);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fVar1 = fdb_shutdown();
      if (fVar1 == FDB_RESULT_SUCCESS) {
        memleak_end();
        __format = "%s PASSED\n";
        if (iterator_seek_to_min_key_with_deletes_test()::__test_pass != '\0') {
          __format = "%s FAILED\n";
        }
        fprintf(_stderr,__format,"iterator seek to min test");
        return;
      }
      goto LAB_0011c920;
    }
  }
  else {
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c8f5:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c8fc:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c903:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c908:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c90d:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c912:
    iterator_seek_to_min_key_with_deletes_test();
  }
  iterator_seek_to_min_key_with_deletes_test();
LAB_0011c920:
  iterator_seek_to_min_key_with_deletes_test();
  iterator_test();
  iterator_with_concurrent_updates_test();
  iterator_compact_uncommitted_db();
  iterator_seek_test();
  insert_opt = 0;
  do {
    iterator_complete_test(insert_opt,0);
    iterator_complete_test(insert_opt,1);
    insert_opt = insert_opt + 1;
  } while (insert_opt != 7);
  iterator_extreme_key_test();
  iterator_inmem_snapshot_seek_test(false);
  iterator_inmem_snapshot_seek_test(true);
  iterator_no_deletes_test();
  iterator_set_del_docs_test();
  iterator_del_next_test();
  sequence_iterator_test();
  sequence_iterator_duplicate_test();
  sequence_iterator_range_test();
  reverse_seek_to_max_nokey();
  reverse_sequence_iterator_test();
  reverse_sequence_iterator_kvs_test();
  reverse_iterator_test();
  iterator_seek_wal_only_test();
  iterator_after_wal_threshold();
  iterator_manual_wal_flush();
  sequence_iterator_seek_test(true);
  sequence_iterator_seek_test(false);
  iterator_concurrent_compaction();
  iterator_offset_access_test();
  iterator_deleted_doc_right_before_the_end_test();
  iterator_uncommited_seeks();
  iterator_init_using_substring_test();
  iterator_seek_to_max_key_with_deletes_test();
  iterator_seek_to_min_key_with_deletes_test();
  return;
}

Assistant:

void iterator_seek_to_min_key_with_deletes_test() {
    TEST_INIT();
    memleak_start();

    int r;

    fdb_status status;
    fdb_kvs_handle *db;
    fdb_file_handle *dbfile;
    fdb_iterator *it = nullptr;
    fdb_doc *rdoc = nullptr;


    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();

    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;
    TEST_STATUS(fdb_open(&dbfile, "./iterator_test1", &fconfig));
    TEST_STATUS(fdb_kvs_open_default(dbfile, &db, &kvs_config));

    fdb_set_kv(db, "B", 1, NULL, 0);
    fdb_set_kv(db, "C", 1, NULL, 0);

    status = fdb_del_kv(db, "B", 1);
    TEST_STATUS(status);

    status = fdb_iterator_init(db, &it, "A", 1, "B", 1, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(it, &rdoc);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);

    status = fdb_iterator_seek_to_min(it);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);

    status = fdb_iterator_close(it);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    status = fdb_shutdown();
    TEST_STATUS(status);

    memleak_end();

    TEST_RESULT("iterator seek to min test");
}